

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O0

float query_decision(active_cover *a,single_learner *l,example *ec,float prediction,float pmin,
                    bool in_dis)

{
  bool bVar1;
  undefined1 in_CL;
  uchar *tbs;
  uchar *in_RDX;
  size_t *siglen;
  size_t *siglen_00;
  EVP_PKEY_CTX *in_RSI;
  uchar *sig;
  uchar *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  float fVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar3;
  double dVar4;
  float in_XMM1_Da;
  size_t i;
  float q2;
  float p;
  uint64_t *initial;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffd4;
  uint uVar5;
  float local_4;
  
  uVar5 = CONCAT13(in_CL,in_stack_ffffffffffffffd4) & 0x1ffffff;
  if (3.0 < *(double *)(**(long **)(in_RDI + 0x28) + 0x18) + (double)*(float *)(in_RDX + 0x6870)) {
    if ((char)(uVar5 >> 0x18) == '\0') {
      local_4 = -1.0;
    }
    else if ((in_RDI[0xc] & 1) == 0) {
      fVar2 = in_XMM1_Da * 4.0 * in_XMM1_Da;
      for (initial = (uint64_t *)0x0; initial < *(uint64_t **)(in_RDI + 0x10);
          initial = (uint64_t *)((long)initial + 1)) {
        tbs = in_RDI;
        sig = in_RDX;
        ctx = in_RSI;
        LEARNER::learner<char,_example>::predict
                  ((learner<char,_example> *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                   (example *)CONCAT44(fVar2,in_stack_ffffffffffffffc8),(size_t)initial);
        sign(ctx,sig,siglen,tbs,in_R8);
        sign(ctx,sig,siglen_00,tbs,in_R8);
        fVar2 = (float)(-(uint)(extraout_XMM0_Da != extraout_XMM0_Da_00) & 0x3f800000) *
                (*(float *)(*(long *)(in_RDI + 0x18) + (long)initial * 4) /
                *(float *)(*(long *)(in_RDI + 0x20) + (long)initial * 4)) + fVar2;
      }
      dVar3 = std::sqrt((double)(ulong)(uint)fVar2);
      dVar4 = std::sqrt((double)(ulong)(uint)fVar2);
      local_4 = SUB84(dVar3,0) / (SUB84(dVar4,0) + 1.0);
      bVar1 = nanpattern(0.0);
      if (bVar1) {
        local_4 = 1.0;
      }
      fVar2 = merand48(initial);
      if (local_4 < fVar2) {
        local_4 = -1.0;
      }
      else {
        local_4 = 1.0 / local_4;
      }
    }
    else {
      local_4 = 1.0;
    }
  }
  else {
    local_4 = 1.0;
  }
  return local_4;
}

Assistant:

float query_decision(active_cover& a, single_learner& l, example& ec, float prediction, float pmin, bool in_dis)
{
  if (a.all->sd->t + ec.weight <= 3)
  {
    return 1.f;
  }

  if (!in_dis)
  {
    return -1.f;
  }

  if (a.oracular)
  {
    return 1.f;
  }

  float p, q2 = 4.f * pmin * pmin;

  for (size_t i = 0; i < a.cover_size; i++)
  {
    l.predict(ec, i + 1);
    q2 += ((float)(sign(ec.pred.scalar) != sign(prediction))) * (a.lambda_n[i] / a.lambda_d[i]);
  }

  p = sqrt(q2) / (1 + sqrt(q2));

  if (nanpattern(p))
  {
    p = 1.f;
  }

  if (merand48(a.all->random_state) <= p)
  {
    return 1.f / p;
  }
  else
  {
    return -1.f;
  }
}